

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::TextureCubeShader::shadeVertices
          (TextureCubeShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  int i;
  anon_union_64_6_e32bd5e8_for_value *paVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  int col;
  long lVar6;
  ulong uVar7;
  float v_1;
  float fVar8;
  Vec4 v_2;
  Vec3 v_coord;
  Vec2 a_coord;
  Mat3 texCoordMat;
  Vec4 local_88;
  Vec4 local_78;
  float local_68 [2];
  VertexPacket **local_60;
  float local_58 [10];
  
  paVar2 = &((this->super_ShaderProgram).m_uniforms.
             super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
             super__Vector_impl_data._M_start)->value;
  pfVar3 = local_58;
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_58[8] = 0.0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    pfVar4 = pfVar3;
    do {
      *pfVar4 = (float)paVar2->i4[lVar6];
      lVar6 = lVar6 + 1;
      pfVar4 = pfVar4 + 3;
    } while (lVar6 != 3);
    lVar5 = lVar5 + 1;
    paVar2 = (anon_union_64_6_e32bd5e8_for_value *)((long)paVar2 + 0xc);
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 3);
  if (0 < numPackets) {
    uVar7 = 0;
    local_60 = packets;
    do {
      pVVar1 = local_60[uVar7];
      local_78.m_data[0] = 0.0;
      local_78.m_data[1] = 0.0;
      local_78.m_data[2] = 0.0;
      local_78.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_78,inputs + 1,pVVar1->instanceNdx,pVVar1->vertexNdx);
      local_88.m_data._0_8_ = &local_78;
      local_88.m_data[2] = 0.0;
      local_88.m_data[3] = 1.4013e-45;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      lVar5 = 0;
      do {
        local_68[lVar5] = local_78.m_data[(int)local_88.m_data[lVar5 + 2]];
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      local_88.m_data[0] = local_68[0];
      local_88.m_data[1] = local_68[1];
      local_88.m_data[2] = 1.0;
      local_88.m_data[3] = 1.4013e-45;
      local_78.m_data[0] = 0.0;
      local_78.m_data[1] = 0.0;
      local_78.m_data._8_8_ = local_78.m_data._8_8_ & 0xffffffff00000000;
      pfVar3 = local_58;
      lVar5 = 0;
      do {
        fVar8 = 0.0;
        lVar6 = 0;
        pfVar4 = pfVar3;
        do {
          fVar8 = fVar8 + *pfVar4 * local_88.m_data[lVar6];
          lVar6 = lVar6 + 1;
          pfVar4 = pfVar4 + 3;
        } while (lVar6 != 3);
        local_78.m_data[lVar5] = fVar8;
        lVar5 = lVar5 + 1;
        pfVar3 = pfVar3 + 1;
      } while (lVar5 != 3);
      local_88.m_data[0] = 0.0;
      local_88.m_data[1] = 0.0;
      local_88.m_data[2] = 0.0;
      local_88.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_88,inputs,pVVar1->instanceNdx,pVVar1->vertexNdx);
      *(undefined8 *)(pVVar1->position).m_data = local_88.m_data._0_8_;
      *(undefined8 *)((pVVar1->position).m_data + 2) = local_88.m_data._8_8_;
      *(undefined8 *)&pVVar1->outputs[0].v = local_78.m_data._0_8_;
      pVVar1->outputs[0].v.uData[2] = (deUint32)local_78.m_data[2];
      pVVar1->outputs[0].v.uData[3] = 0;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)numPackets);
  }
  return;
}

Assistant:

void TextureCubeShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	tcu::Mat3 texCoordMat = tcu::Mat3(m_uniforms[0].value.m3);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::VertexPacket&	packet	= *packets[packetNdx];
		tcu::Vec2			a_coord = rr::readVertexAttribFloat(inputs[1], packet.instanceNdx, packet.vertexNdx).xy();
		tcu::Vec3			v_coord = texCoordMat * tcu::Vec3(a_coord.x(), a_coord.y(), 1.0f);

		packet.position				= rr::readVertexAttribFloat(inputs[0], packet.instanceNdx, packet.vertexNdx);
		packet.outputs[0]			= tcu::Vec4(v_coord.x(), v_coord.y(), v_coord.z(), 0.0f);
	}
}